

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb_aug.c
# Opt level: O0

wtree_node_t * wtree_walk_next(wtree_walk *it,int dir,wtree_node_t **r_left,wtree_node_t **r_right)

{
  wtree_node_t *pwVar1;
  int iVar2;
  wtree_node_t *pwVar3;
  bool bVar4;
  wtree_node_t *parent;
  wtree_node_t *right;
  wtree_node_t *left;
  wtree_node_t *node;
  wtree_node_t **r_right_local;
  wtree_node_t **r_left_local;
  int dir_local;
  wtree_walk *it_local;
  
  if (it->count == 0) {
    left = it->path[0].node;
    if (left == (wtree_node_t *)0x0) {
      return (wtree_node_t *)0x0;
    }
    it->count = it->count + 1;
  }
  else {
    pwVar1 = it->path[it->count + -1].node;
    it->path[it->count + -1].dir = dir;
    left = (pwVar1->in_tree).rbn_left;
    pwVar3 = (wtree_node_t *)((ulong)(pwVar1->in_tree).rbn_right_red & 0xfffffffffffffffe);
    if ((((dir & 1U) == 0) || (left == (wtree_node *)0x0)) &&
       (((dir & 2U) == 0 || (left = pwVar3, pwVar3 == (wtree_node_t *)0x0)))) {
      do {
        left = pwVar1;
        iVar2 = it->count + -1;
        it->count = iVar2;
        if (iVar2 < 1) break;
        pwVar1 = it->path[it->count + -1].node;
        pwVar3 = (wtree_node_t *)((ulong)(pwVar1->in_tree).rbn_right_red & 0xfffffffffffffffe);
      } while ((((it->path[it->count + -1].dir & 2U) == 0) || (pwVar3 == (wtree_node_t *)0x0)) ||
              (bVar4 = pwVar3 == left, left = pwVar3, bVar4));
      if (it->count == 0) {
        return (wtree_node_t *)0x0;
      }
    }
    iVar2 = it->count;
    it->count = iVar2 + 1;
    it->path[iVar2].node = left;
  }
  *r_left = (left->in_tree).rbn_left;
  *r_right = (wtree_node_t *)((ulong)(left->in_tree).rbn_right_red & 0xfffffffffffffffe);
  return left;
}

Assistant:

static void
wtree_selfcheck(wtree_t *tree)
{
	wtree_node_t *node, *prev, *left, *right;

	/* Check node order. */
	struct wtree_iterator it;
	wtree_ifirst(tree, &it);
	prev = NULL;
	while ((node = wtree_inext(&it)) != NULL) {
		if (prev != NULL)
			fail_unless(prev->value <= node->value);
		prev = node;
	}

	/* Check node weights. */
	struct wtree_walk walk;
	wtree_walk_init(&walk, tree);
	while ((node = wtree_walk_next(&walk, RB_WALK_RIGHT | RB_WALK_LEFT,
				       &left, &right)) != NULL) {
		int left_weight = left != NULL ? left->weight : 0;
		int right_weight = right != NULL ? right->weight : 0;
		fail_unless(node->weight == left_weight + right_weight + 1);
	}
}